

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.hpp
# Opt level: O0

QAction * __thiscall
QtMWidgets::ToolBar::addAction<void(Object::*)()>
          (ToolBar *this,QIcon *icon,Object *receiver,Function slot)

{
  Object *pOVar1;
  QAction *this_00;
  Object local_78 [11];
  undefined1 local_6d;
  QString local_60;
  QAction *local_48;
  QAction *action;
  Function slot_local;
  Object *local_30;
  Object *receiver_local;
  QIcon *icon_local;
  ToolBar *this_local;
  
  action = (QAction *)slot;
  local_30 = receiver;
  receiver_local = (Object *)icon;
  icon_local = (QIcon *)this;
  this_local = (ToolBar *)slot;
  this_00 = (QAction *)operator_new(0x10);
  pOVar1 = receiver_local;
  local_6d = 1;
  QString::QString(&local_60);
  QAction::QAction(this_00,(QIcon *)pOVar1,(QString *)&local_60,(QObject *)this);
  local_6d = 0;
  QString::~QString(&local_60);
  local_48 = this_00;
  QObject::connect<void(QAction::*)(bool),void(Object::*)()>
            (local_78,(offset_in_QAction_to_subr)this_00,(Object *)QAction::triggered,0,
             (ConnectionType)local_30);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  QWidget::addAction((QAction *)this);
  return local_48;
}

Assistant:

inline QAction * addAction( const QIcon & icon,
		const typename QtPrivate::FunctionPointer< Func1 >::Object * receiver,
		Func1 slot )
	{
		QAction * action = new QAction( icon, QString(), this );
		QObject::connect( action, &QAction::triggered, receiver, slot );
		addAction( action );
		return action;
	}